

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExclusivePublication.cpp
# Opt level: O1

void __thiscall aeron::ExclusivePublication::~ExclusivePublication(ExclusivePublication *this)

{
  void *pvVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar2;
  long lVar3;
  
  this->_vptr_ExclusivePublication = (_func_int **)&PTR__ExclusivePublication_00163c98;
  ClientConductor::releaseExclusivePublication(this->m_conductor,this->m_registrationId);
  lVar3 = 0;
  do {
    pvVar1 = *(void **)((long)&this->m_appenders[2]._M_t.
                               super___uniq_ptr_impl<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
                               .
                               super__Head_base<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_false>
                               ._M_head_impl + lVar3);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    *(undefined8 *)
     ((long)&this->m_appenders[2]._M_t.
             super___uniq_ptr_impl<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
             ._M_t.
             super__Tuple_impl<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
             .super__Head_base<0UL,_aeron::concurrent::logbuffer::ExclusiveTermAppender_*,_false>.
             _M_head_impl + lVar3) = 0;
    lVar3 = lVar3 + -8;
  } while (lVar3 != -0x18);
  this_00 = (this->m_logBuffers).super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pcVar2 = (this->m_channel)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_channel).field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

ExclusivePublication::~ExclusivePublication()
{
    m_conductor.releaseExclusivePublication(m_registrationId);
}